

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleProfileDef::~IfcRectangleProfileDef
          (IfcRectangleProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcRectangleProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef,_2UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,vtt + 10);
  IfcParameterizedProfileDef::~IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  return;
}

Assistant:

IfcRectangleProfileDef() : Object("IfcRectangleProfileDef") {}